

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::getAutotuneMetricLabel_abi_cxx11_(Args *this)

{
  ulong uVar1;
  runtime_error *this_00;
  long in_RSI;
  string *in_RDI;
  Args *in_stack_00000018;
  size_t semicolon;
  metric_name metric;
  string *label;
  string local_98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string local_70 [32];
  undefined8 local_50;
  string local_38 [35];
  undefined1 local_15;
  metric_name local_14;
  
  local_14 = getAutotuneMetric(in_stack_00000018);
  local_15 = 0;
  std::__cxx11::string::string(in_RDI);
  if (local_14 == f1scoreLabel) {
    std::__cxx11::string::substr((ulong)local_38,in_RSI + 0x148);
    std::__cxx11::string::operator=(in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
  }
  else {
    if ((local_14 != precisionAtRecallLabel) && (local_14 != recallAtPrecisionLabel)) {
      return in_RDI;
    }
    local_50 = std::__cxx11::string::find((char *)(in_RSI + 0x148),0x1e4d2b);
    std::__cxx11::string::substr((ulong)local_70,(ulong)(in_RSI + 0x148));
    std::__cxx11::string::operator=(in_RDI,local_70);
    std::__cxx11::string::~string(local_70);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    return in_RDI;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff80);
  std::runtime_error::runtime_error(this_00,local_98);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Args::getAutotuneMetricLabel() const {
  metric_name metric = getAutotuneMetric();
  std::string label;
  if (metric == metric_name::f1scoreLabel) {
    label = autotuneMetric.substr(3);
  } else if (
      metric == metric_name::precisionAtRecallLabel ||
      metric == metric_name::recallAtPrecisionLabel) {
    size_t semicolon = autotuneMetric.find(":", 18);
    label = autotuneMetric.substr(semicolon + 1);
  } else {
    return label;
  }

  if (label.empty()) {
    throw std::runtime_error("Empty metric label : " + autotuneMetric);
  }
  return label;
}